

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_panel.cxx
# Opt level: O0

Fl_Double_Window * make_template_panel(void)

{
  Fl_Widget *pFVar1;
  Fl_Browser *this;
  Fl_Group *pFVar2;
  Fl_Button *pFVar3;
  Fl_Group *this_00;
  Fl_Button *o_2;
  Fl_Box *o_1;
  Fl_Group *o;
  
  pFVar1 = (Fl_Widget *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)pFVar1,0x1cc,0x163,"New/Save Template");
  template_panel = (Fl_Double_Window *)pFVar1;
  Fl_Widget::callback(pFVar1,cb_template_panel);
  this = (Fl_Browser *)operator_new(0x2a0);
  Fl_Browser::Fl_Browser(this,10,0x1c,0xb4,0xfa,"Available Templates:");
  template_browser = this;
  Fl_Widget::type((Fl_Widget *)this,'\x02');
  Fl_Widget::labelfont((Fl_Widget *)template_browser,1);
  Fl_Widget::callback((Fl_Widget *)template_browser,cb_template_browser);
  Fl_Widget::align((Fl_Widget *)template_browser,5);
  Fl_Widget::when((Fl_Widget *)template_browser,'\x03');
  pFVar1 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar1,200,0x1c,0xfa,0xfa,(char *)0x0);
  template_preview = (Fl_Box *)pFVar1;
  Fl_Widget::box(pFVar1,FL_THIN_DOWN_BOX);
  Fl_Widget::align(&template_preview->super_Fl_Widget,0x55);
  pFVar2 = Fl_Group::current();
  Fl_Group::resizable(pFVar2,&template_preview->super_Fl_Widget);
  pFVar1 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar1,0xc6,0x120,0xfc,0x19,"Template Name:");
  template_name = (Fl_Input *)pFVar1;
  Fl_Widget::labelfont(pFVar1,1);
  Fl_Input_::textfont(&template_name->super_Fl_Input_,4);
  Fl_Widget::callback((Fl_Widget *)template_name,cb_template_name);
  Fl_Widget::when((Fl_Widget *)template_name,'\x03');
  pFVar1 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar1,0xc6,0x120,0xfc,0x19,"Instance Name:");
  template_instance = (Fl_Input *)pFVar1;
  Fl_Widget::labelfont(pFVar1,1);
  Fl_Input_::textfont(&template_instance->super_Fl_Input_,4);
  (*(template_instance->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[6])();
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,0x143,0x1b8,0x19,(char *)0x0);
  pFVar3 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar3,10,0x143,0x8f,0x19,"Delete Template");
  template_delete = pFVar3;
  Fl_Widget::callback((Fl_Widget *)pFVar3,template_delete_cb);
  pFVar1 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar1,0x99,0x143,0x7e,0x19,(char *)0x0);
  this_00 = Fl_Group::current();
  Fl_Group::resizable(this_00,pFVar1);
  pFVar3 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar3,0x121,0x143,0x48,0x19,"Cancel");
  Fl_Widget::callback((Fl_Widget *)pFVar3,cb_Cancel);
  pFVar1 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar1,0x173,0x143,0x4f,0x19,"Save");
  template_submit = (Fl_Return_Button *)pFVar1;
  Fl_Widget::callback(pFVar1,cb_template_submit);
  Fl_Group::end(pFVar2);
  Fl_Window::set_modal(&template_panel->super_Fl_Window);
  Fl_Group::end((Fl_Group *)template_panel);
  return template_panel;
}

Assistant:

Fl_Double_Window* make_template_panel() {
  { template_panel = new Fl_Double_Window(460, 355, "New/Save Template");
    template_panel->callback((Fl_Callback*)cb_template_panel);
    { template_browser = new Fl_Browser(10, 28, 180, 250, "Available Templates:");
      template_browser->type(2);
      template_browser->labelfont(1);
      template_browser->callback((Fl_Callback*)cb_template_browser);
      template_browser->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      template_browser->when(3);
    } // Fl_Browser* template_browser
    { template_preview = new Fl_Box(200, 28, 250, 250);
      template_preview->box(FL_THIN_DOWN_BOX);
      template_preview->align(Fl_Align(69|FL_ALIGN_INSIDE));
      Fl_Group::current()->resizable(template_preview);
    } // Fl_Box* template_preview
    { template_name = new Fl_Input(198, 288, 252, 25, "Template Name:");
      template_name->labelfont(1);
      template_name->textfont(4);
      template_name->callback((Fl_Callback*)cb_template_name);
      template_name->when(3);
    } // Fl_Input* template_name
    { template_instance = new Fl_Input(198, 288, 252, 25, "Instance Name:");
      template_instance->labelfont(1);
      template_instance->textfont(4);
      template_instance->hide();
    } // Fl_Input* template_instance
    { Fl_Group* o = new Fl_Group(10, 323, 440, 25);
      { template_delete = new Fl_Button(10, 323, 143, 25, "Delete Template");
        template_delete->callback((Fl_Callback*)template_delete_cb);
      } // Fl_Button* template_delete
      { Fl_Box* o = new Fl_Box(153, 323, 126, 25);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      { Fl_Button* o = new Fl_Button(289, 323, 72, 25, "Cancel");
        o->callback((Fl_Callback*)cb_Cancel);
      } // Fl_Button* o
      { template_submit = new Fl_Return_Button(371, 323, 79, 25, "Save");
        template_submit->callback((Fl_Callback*)cb_template_submit);
      } // Fl_Return_Button* template_submit
      o->end();
    } // Fl_Group* o
    template_panel->set_modal();
    template_panel->end();
  } // Fl_Double_Window* template_panel
  return template_panel;
}